

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Function::IsRecursive(Function *this)

{
  bool bVar1;
  const_reference this_00;
  pointer this_01;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *this_02;
  pointer this_03;
  undefined1 local_90 [8];
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> roots;
  undefined1 local_38 [8];
  ProcessFunction mark_visited;
  IRContext *ctx;
  Function *this_local;
  
  this_00 = std::
            vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ::front(&this->blocks_);
  this_01 = std::
            unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
            operator->(this_00);
  this_02 = BasicBlock::GetLabel(this_01);
  this_03 = std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::operator->(this_02);
  mark_visited._M_invoker = (_Invoker_type)opt::Instruction::context(this_03);
  roots.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this;
  std::function<bool(spvtools::opt::Function*)>::
  function<spvtools::opt::Function::IsRecursive()const::__0,void>
            ((function<bool(spvtools::opt::Function*)> *)local_38,
             (anon_class_8_1_8991fb9c *)
             &roots.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node);
  std::queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  queue<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
            ((queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>> *)local_90);
  IRContext::AddCalls((IRContext *)mark_visited._M_invoker,this,
                      (queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                       *)local_90);
  bVar1 = IRContext::ProcessCallTreeFromRoots
                    ((IRContext *)mark_visited._M_invoker,(ProcessFunction *)local_38,
                     (queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)local_90);
  std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::~queue
            ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             local_90);
  std::function<bool_(spvtools::opt::Function_*)>::~function
            ((function<bool_(spvtools::opt::Function_*)> *)local_38);
  return bVar1;
}

Assistant:

bool Function::IsRecursive() const {
  IRContext* ctx = blocks_.front()->GetLabel()->context();
  IRContext::ProcessFunction mark_visited = [this](Function* fp) {
    return fp == this;
  };

  // Process the call tree from all of the function called by |this|.  If it get
  // back to |this|, then we have a recursive function.
  std::queue<uint32_t> roots;
  ctx->AddCalls(this, &roots);
  return ctx->ProcessCallTreeFromRoots(mark_visited, &roots);
}